

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImVector_ImFontGlyph * ImVector_ImFontGlyph_ImVector_ImFontGlyphVector(ImVector_ImFontGlyph *src)

{
  uint uVar1;
  ImVector_ImFontGlyph *pIVar2;
  ImFontGlyph *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_ImFontGlyph *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImFontGlyph *)0x0;
  uVar1 = src->Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (ImFontGlyph *)0x0;
  }
  else {
    uVar3 = 8;
    if (8 < uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImFontGlyph *)ImGui::MemAlloc(uVar3 * 0x28);
    if (pIVar2->Data != (ImFontGlyph *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size * 0x28);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(__dest,src->Data,(long)(int)uVar1 * 0x28);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImFontGlyph* ImVector_ImFontGlyph_ImVector_ImFontGlyphVector(const ImVector_ImFontGlyph src)
{
    return IM_NEW(ImVector_ImFontGlyph)(src);
}